

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O0

void Gia_PolynPrintMono(Vec_Int_t *vConst,Vec_Int_t *vMono,int Prev)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  int local_20;
  int Entry;
  int k;
  int Prev_local;
  Vec_Int_t *vMono_local;
  Vec_Int_t *vConst_local;
  
  iVar2 = Vec_IntEntry(vConst,0);
  iVar2 = Abc_AbsInt(iVar2);
  uVar3 = 0x20;
  if (Prev != iVar2) {
    uVar3 = 0x7c;
  }
  printf("%c ",uVar3);
  for (local_20 = 0; iVar2 = Vec_IntSize(vConst), local_20 < iVar2; local_20 = local_20 + 1) {
    iVar2 = Vec_IntEntry(vConst,local_20);
    pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
    if (iVar2 < 0) {
      pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
    }
    iVar2 = Abc_AbsInt(iVar2);
    printf("%s2^%d",pcVar1 + 0x4a,(ulong)(iVar2 - 1));
  }
  for (local_20 = 0; iVar2 = Vec_IntSize(vMono), local_20 < iVar2; local_20 = local_20 + 1) {
    iVar2 = Vec_IntEntry(vMono,local_20);
    printf(" * i%d",(ulong)(iVar2 - 1));
  }
  printf("\n");
  return;
}

Assistant:

void Gia_PolynPrintMono( Vec_Int_t * vConst, Vec_Int_t * vMono, int Prev )
{
    int k, Entry;
    printf( "%c ", Prev != Abc_AbsInt(Vec_IntEntry(vConst, 0)) ? '|' : ' ' );
    Vec_IntForEachEntry( vConst, Entry, k )
        printf( "%s2^%d", Entry < 0 ? "-" : "+", Abc_AbsInt(Entry)-1 );
    Vec_IntForEachEntry( vMono, Entry, k )
        printf( " * i%d", Entry-1 );
    printf( "\n" );
}